

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

idx_t duckdb::IEJoinUnion::AppendKey
                (SortedTable *table,ExpressionExecutor *executor,SortedTable *marked,
                int64_t increment,int64_t base,idx_t block_idx)

{
  GlobalSortState *global_sort_state;
  ulong uVar1;
  __int_type _Var2;
  __int_type _Var3;
  idx_t count;
  Allocator *pAVar4;
  pointer pRVar5;
  long lVar6;
  reference this;
  idx_t iVar7;
  ulong uVar8;
  idx_t local_220;
  vector<duckdb::LogicalType,_true> types;
  PayloadScanner scanner;
  DataChunk scanned;
  DataChunk payload;
  DataChunk keys;
  LocalSortState local_sort_state;
  
  LocalSortState::LocalSortState(&local_sort_state);
  global_sort_state = &marked->global_sort_state;
  LocalSortState::Initialize
            (&local_sort_state,global_sort_state,(marked->global_sort_state).buffer_manager);
  _Var2 = (table->count).super___atomic_base<unsigned_long>._M_i;
  _Var3 = (table->has_null).super___atomic_base<unsigned_long>._M_i;
  PayloadScanner::PayloadScanner(&scanner,&table->global_sort_state,block_idx,false);
  uVar8 = block_idx * (table->global_sort_state).block_capacity;
  DataChunk::DataChunk(&scanned);
  pAVar4 = Allocator::DefaultAllocator();
  pRVar5 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(&scanner.scanner);
  DataChunk::Initialize(&scanned,pAVar4,&(pRVar5->layout).types,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &((local_sort_state.sort_layout)->logical_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  lVar6 = (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>,void>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&types,
             (const_iterator)
             types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             ((local_sort_state.payload_layout)->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start,
             ((local_sort_state.payload_layout)->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish);
  DataChunk::DataChunk(&keys);
  DataChunk::DataChunk(&payload);
  pAVar4 = Allocator::DefaultAllocator();
  DataChunk::Initialize(&keys,pAVar4,&types,0x800);
  uVar1 = _Var2 - _Var3;
  local_220 = 0;
  while (uVar8 <= uVar1 && uVar1 - uVar8 != 0) {
    DataChunk::Reset(&scanned);
    PayloadScanner::Scan(&scanner,&scanned);
    if (uVar1 < scanned.count + uVar8) {
      scanned.count = uVar1 - uVar8;
    }
    count = scanned.count;
    if (scanned.count == 0) break;
    DataChunk::Reset(&keys);
    DataChunk::Split(&keys,&payload,
                     ((long)types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)types.
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
    ExpressionExecutor::Execute(executor,&scanned,&keys);
    this = vector<duckdb::Vector,_true>::get<true>(&payload.data,0);
    Vector::Sequence(this,base,increment,count);
    payload.count = count;
    DataChunk::Fuse(&keys,&payload);
    DataChunk::Split(&keys,&payload,lVar6 / 0x18);
    LocalSortState::SinkChunk(&local_sort_state,&keys,&payload);
    DataChunk::Fuse(&keys,&payload);
    iVar7 = LocalSortState::SizeInBytes(&local_sort_state);
    uVar8 = uVar8 + count;
    base = base + count * increment;
    local_220 = local_220 + count;
    if (marked->memory_per_thread <= iVar7) {
      LocalSortState::Sort(&local_sort_state,global_sort_state,true);
    }
  }
  GlobalSortState::AddLocalState(global_sort_state,&local_sort_state);
  LOCK();
  (marked->count).super___atomic_base<unsigned_long>._M_i =
       (marked->count).super___atomic_base<unsigned_long>._M_i + local_220;
  UNLOCK();
  DataChunk::~DataChunk(&payload);
  DataChunk::~DataChunk(&keys);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  DataChunk::~DataChunk(&scanned);
  PayloadScanner::~PayloadScanner(&scanner);
  LocalSortState::~LocalSortState(&local_sort_state);
  return local_220;
}

Assistant:

idx_t IEJoinUnion::AppendKey(SortedTable &table, ExpressionExecutor &executor, SortedTable &marked, int64_t increment,
                             int64_t base, const idx_t block_idx) {
	LocalSortState local_sort_state;
	local_sort_state.Initialize(marked.global_sort_state, marked.global_sort_state.buffer_manager);

	// Reading
	const auto valid = table.count - table.has_null;
	auto &gstate = table.global_sort_state;
	PayloadScanner scanner(gstate, block_idx);
	auto table_idx = block_idx * gstate.block_capacity;

	DataChunk scanned;
	scanned.Initialize(Allocator::DefaultAllocator(), scanner.GetPayloadTypes());

	// Writing
	auto types = local_sort_state.sort_layout->logical_types;
	const idx_t payload_idx = types.size();

	const auto &payload_types = local_sort_state.payload_layout->GetTypes();
	types.insert(types.end(), payload_types.begin(), payload_types.end());
	const idx_t rid_idx = types.size() - 1;

	DataChunk keys;
	DataChunk payload;
	keys.Initialize(Allocator::DefaultAllocator(), types);

	idx_t inserted = 0;
	for (auto rid = base; table_idx < valid;) {
		scanned.Reset();
		scanner.Scan(scanned);

		// NULLs are at the end, so stop when we reach them
		auto scan_count = scanned.size();
		if (table_idx + scan_count > valid) {
			scan_count = valid - table_idx;
			scanned.SetCardinality(scan_count);
		}
		if (scan_count == 0) {
			break;
		}
		table_idx += scan_count;

		// Compute the input columns from the payload
		keys.Reset();
		keys.Split(payload, rid_idx);
		executor.Execute(scanned, keys);

		// Mark the rid column
		payload.data[0].Sequence(rid, increment, scan_count);
		payload.SetCardinality(scan_count);
		keys.Fuse(payload);
		rid += increment * UnsafeNumericCast<int64_t>(scan_count);

		// Sort on the sort columns (which will no longer be needed)
		keys.Split(payload, payload_idx);
		local_sort_state.SinkChunk(keys, payload);
		inserted += scan_count;
		keys.Fuse(payload);

		// Flush when we have enough data
		if (local_sort_state.SizeInBytes() >= marked.memory_per_thread) {
			local_sort_state.Sort(marked.global_sort_state, true);
		}
	}
	marked.global_sort_state.AddLocalState(local_sort_state);
	marked.count += inserted;

	return inserted;
}